

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

float forcefloat(tagval *v)

{
  byte *__nptr;
  long lVar1;
  char *pcVar2;
  double dVar3;
  anon_union_8_5_08252708_for_identval_0 local_20;
  float local_14;
  
  local_14 = 0.0;
  switch(v->type) {
  case 1:
    local_14 = (float)(v->super_identval).field_0.i;
    break;
  case 2:
    return (v->super_identval).field_0.f;
  case 3:
  case 6:
    __nptr = (byte *)(v->super_identval).field_0.s;
    dVar3 = strtod((char *)__nptr,&local_20.s);
    if ((((dVar3 != 0.0) || (NAN(dVar3))) || ((byte *)local_20.s == __nptr)) ||
       ((byte)(*local_20.s | 0x20U) != 0x78)) {
      local_14 = (float)dVar3;
    }
    else {
      lVar1 = strtol((char *)__nptr,(char **)0x0,0);
      local_14 = (float)(int)lVar1;
    }
  }
  if (v->type == 5) {
    pcVar2 = (v->super_identval).field_0.s;
    if (*(int *)(pcVar2 + -4) != 0) goto LAB_00132d9f;
    pcVar2 = pcVar2 + -4;
  }
  else if ((v->type != 3) || (pcVar2 = (v->super_identval).field_0.s, pcVar2 == (char *)0x0))
  goto LAB_00132d9f;
  operator_delete__(pcVar2);
LAB_00132d9f:
  v->type = 2;
  (v->super_identval).field_0.f = local_14;
  return local_14;
}

Assistant:

static inline float forcefloat(tagval &v)
{
    float f = 0.0f;
    switch(v.type)
    {
        case VAL_INT: f = v.i; break;
        case VAL_STR: f = parsefloat(v.s); break;
        case VAL_MACRO: f = parsefloat(v.s); break;
        case VAL_FLOAT: return v.f;
    }
    freearg(v);
    v.setfloat(f);
    return f;
}